

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int commission_handshake_secret(ptls_t *tls)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *paVar11;
  
  puVar2 = tls->pending_handshake_secret;
  if (puVar2 != (uint8_t *)0x0) {
    bVar1 = tls->field_0x1e8;
    paVar11 = &tls->traffic_protection;
    if ((bVar1 & 1) == 0) {
      paVar11 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
    }
    uVar3 = *(undefined8 *)puVar2;
    uVar4 = *(undefined8 *)(puVar2 + 8);
    uVar5 = *(undefined8 *)(puVar2 + 0x10);
    uVar6 = *(undefined8 *)(puVar2 + 0x18);
    uVar7 = *(undefined8 *)(puVar2 + 0x28);
    uVar8 = *(undefined8 *)(puVar2 + 0x30);
    uVar9 = *(undefined8 *)(puVar2 + 0x38);
    *(undefined8 *)((paVar11->dec).secret + 0x20) = *(undefined8 *)(puVar2 + 0x20);
    *(undefined8 *)((paVar11->dec).secret + 0x28) = uVar7;
    *(undefined8 *)((paVar11->dec).secret + 0x30) = uVar8;
    *(undefined8 *)((paVar11->dec).secret + 0x38) = uVar9;
    *(undefined8 *)(paVar11->dec).secret = uVar3;
    *(undefined8 *)((paVar11->dec).secret + 8) = uVar4;
    *(undefined8 *)((paVar11->dec).secret + 0x10) = uVar5;
    *(undefined8 *)((paVar11->dec).secret + 0x18) = uVar6;
    (*ptls_clear_memory)(puVar2,0x40);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = (uint8_t *)0x0;
    iVar10 = setup_traffic_protection(tls,bVar1 & 1 ^ 1,(char *)0x0,2,0,1);
    return iVar10;
  }
  __assert_fail("tls->pending_handshake_secret != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                0x695,"int commission_handshake_secret(ptls_t *)");
}

Assistant:

static int commission_handshake_secret(ptls_t *tls)
{
    int is_enc = !ptls_is_server(tls);

    assert(tls->pending_handshake_secret != NULL);
    memcpy((is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec)->secret, tls->pending_handshake_secret,
           PTLS_MAX_DIGEST_SIZE);
    ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = NULL;

    return setup_traffic_protection(tls, is_enc, NULL, 2, 0, 1);
}